

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_base.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonschema::
schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::insert_unknown_keyword
          (schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,uri_wrapper *uri,string *key,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *value)

{
  __normal_iterator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_*,_std::vector<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_std::allocator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>_>
  __last;
  bool bVar1;
  json_type jVar2;
  __normal_iterator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_*,_std::vector<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_std::allocator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>_>
  _Var3;
  undefined8 key_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  keys;
  undefined1 local_490 [16];
  size_type local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  __uniq_ptr_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
  local_468;
  _Any_data local_460;
  anchor_uri_map_type anchor_dict2;
  uri_wrapper new_uri;
  uri_wrapper local_360;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_2a8;
  string *local_298;
  byte local_290;
  uri_wrapper new_u;
  
  uri_wrapper::append(&new_u,uri,key);
  uri_wrapper::uri_wrapper(&new_uri,&new_u);
  if ((new_uri.uri_.fragment_part_.second != new_uri.uri_.fragment_part_.first) &&
     (new_uri.has_plain_name_fragment_ == false)) {
    _Var3._M_current =
         (this->unresolved_refs_).
         super__Vector_base<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_std::allocator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->unresolved_refs_).
         super__Vector_base<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_std::allocator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    uri_wrapper::uri_wrapper(&local_360,&new_uri);
    _Var3 = std::
            find_if<__gnu_cxx::__normal_iterator<std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>*,std::vector<std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>,std::allocator<std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>>>>,jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::insert_unknown_keyword(jsoncons::jsonschema::uri_wrapper_const&,std::__cxx11::string_const&,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&)::_lambda(std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>const&)_1_>
                      (_Var3,__last,(anon_class_184_1_f15b012d_for__M_pred *)&local_360);
    uri_wrapper::~uri_wrapper(&local_360);
    if (_Var3._M_current ==
        (this->unresolved_refs_).
        super__Vector_base<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_std::allocator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Rb_tree<jsoncons::uri,std::pair<jsoncons::uri_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::_Select1st<std::pair<jsoncons::uri_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
      ::
      _M_emplace_unique<jsoncons::uri_const&,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
                ((_Rb_tree<jsoncons::uri,std::pair<jsoncons::uri_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::_Select1st<std::pair<jsoncons::uri_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                  *)&this->unknown_keywords_,&new_uri.uri_,value);
    }
    else {
      anchor_dict2._M_h._M_buckets = &anchor_dict2._M_h._M_single_bucket;
      anchor_dict2._M_h._M_bucket_count = 1;
      anchor_dict2._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      anchor_dict2._M_h._M_element_count = 0;
      anchor_dict2._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      anchor_dict2._M_h._M_rehash_policy._M_next_resize = 0;
      anchor_dict2._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_490._8_8_ = local_460._M_pod_data + 8;
      local_480 = 1;
      local_478._M_allocated_capacity = 0;
      local_478._8_8_ = 0;
      local_468._M_t.
      super__Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
              )0x3f800000;
      local_460._M_unused._M_object = (void *)0x0;
      local_460._8_8_ = 0;
      compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::compilation_context
                ((compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)&local_2a8.common_,&new_uri,
                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_490 + 8));
      keys.size_ = 0;
      keys.data_ = (pointer)value;
      make_cross_draft_schema_validator
                ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)local_490,
                 (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)&local_2a8.common_,keys,(anchor_uri_map_type *)0x0);
      std::
      vector<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
      ::
      emplace_back<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                ((vector<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
                  *)&this->schema_validators_,
                 (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                  *)local_490);
      if ((_Tuple_impl<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
           )local_490._0_8_ !=
          (schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)0x0) {
        (**(code **)((long)*(validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                             *)local_490._0_8_ + 8))();
      }
      local_490._0_8_ =
           (__uniq_ptr_impl<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
            )0x0;
      compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::~compilation_context
                ((compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)&local_2a8.common_);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(local_490 + 8));
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&anchor_dict2._M_h);
    }
    jVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type(value);
    if (jVar2 == object_value) {
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      object_range_abi_cxx11_
                ((const_object_range_type *)&local_2a8.common_,
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)value);
      key_00 = local_2a8._0_8_;
      while( true ) {
        bVar1 = local_2a8.short_str_.data_[6] == local_290;
        if ((local_2a8.short_str_.data_[6] & local_290 & 1) != 0) {
          bVar1 = (string *)key_00 == local_298;
        }
        if (bVar1) break;
        insert_unknown_keyword
                  (this,&new_uri,(string *)key_00,
                   (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   (key_00 + 0x20));
        key_00 = &((string *)(key_00 + 0x20))->field_2;
      }
    }
  }
  uri_wrapper::~uri_wrapper(&new_uri);
  uri_wrapper::~uri_wrapper(&new_u);
  return;
}

Assistant:

void insert_unknown_keyword(const uri_wrapper& uri, 
                                    const std::string& key, 
                                    const Json& value)
        {
            auto new_u = uri.append(key);
            uri_wrapper new_uri(new_u);

            if (new_uri.has_fragment() && !new_uri.has_plain_name_fragment()) 
            {
                // is there a reference looking for this unknown-keyword, which is thus no longer a unknown keyword but a schema
                auto unresolved_refs = std::find_if(this->unresolved_refs_.begin(), this->unresolved_refs_.end(),
                    [new_uri](const std::pair<jsoncons::uri,ref<Json>*>& pr) {return pr.first == new_uri.uri();});
                if (unresolved_refs != this->unresolved_refs_.end())
                {
                    anchor_uri_map_type anchor_dict2;
                    this->save_schema(make_cross_draft_schema_validator(compilation_context<Json>(new_uri), value, {}, anchor_dict2));
                }
                else // no, nothing ref'd it, keep for later
                {
                    //file.unknown_keywords.emplace(fragment, value);
                    this->unknown_keywords_.emplace(new_uri.uri(), value);
                }

                // recursively add possible subschemas of unknown keywords
                if (value.type() == json_type::object_value)
                {
                    for (const auto& subsch : value.object_range())
                    {
                        insert_unknown_keyword(new_uri, subsch.key(), subsch.value());
                    }
                }
            }
        }